

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  byte *pbVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  WhereTerm *pWVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  WhereTerm *pWVar12;
  long in_FS_OFFSET;
  int k;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pWC->nBase < 1) {
    uVar10 = 0;
  }
  else {
    uVar3 = pLoop->maskSelf;
    uVar4 = pLoop->prereq;
    pWVar12 = pWC->a;
    uVar10 = 0;
    iVar11 = pWC->nBase;
    do {
      if ((((pWVar12->prereqAll & ~(uVar3 | uVar4)) == 0) &&
          ((pLoop->maskSelf & pWVar12->prereqAll) != 0)) && ((pWVar12->wtFlags & 2) == 0)) {
        uVar2 = pLoop->nLTerm;
        uVar8 = (ulong)uVar2;
        if (uVar2 != 0) {
          uVar8 = (ulong)uVar2;
          do {
            pWVar5 = pLoop->aLTerm[uVar8 - 1];
            if ((pWVar5 != (WhereTerm *)0x0) &&
               ((pWVar5 == pWVar12 ||
                ((-1 < (long)pWVar5->iParent && (pWC->a + pWVar5->iParent == pWVar12))))))
            goto LAB_0019dc37;
            bVar6 = 1 < (long)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar6);
          uVar8 = 0;
        }
LAB_0019dc37:
        if ((int)uVar8 < 1) {
          sqlite3ProgressCheck(pWC->pWInfo->pParse);
          if ((pLoop->maskSelf == pWVar12->prereqAll) &&
             (((pWVar12->eOperator & 0x3f) != 0 ||
              ((pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype & 0x48) == 0)))) {
            pbVar1 = (byte *)((long)&pLoop->wsFlags + 2);
            *pbVar1 = *pbVar1 | 0x80;
          }
          if (pWVar12->truthProb < 1) {
            pLoop->nOut = pLoop->nOut + pWVar12->truthProb;
          }
          else {
            pLoop->nOut = pLoop->nOut + -1;
            if ((pWVar12->eOperator & 0x82) != 0) {
              local_3c = 0;
              iVar7 = sqlite3ExprIsInteger(pWVar12->pExpr->pRight,(int *)&local_3c,(Parse *)0x0);
              uVar9 = local_3c + 1;
              local_3c = 0x14;
              if (uVar9 < 3) {
                local_3c = 10;
              }
              if (iVar7 == 0) {
                local_3c = 0x14;
              }
              if (uVar10 < local_3c) {
                pbVar1 = (byte *)((long)&pWVar12->wtFlags + 1);
                *pbVar1 = *pbVar1 | 0x20;
                uVar10 = local_3c;
              }
            }
          }
        }
      }
      pWVar12 = pWVar12 + 1;
      bVar6 = 1 < iVar11;
      iVar11 = iVar11 + -1;
    } while (bVar6);
  }
  if ((int)((int)nRow - uVar10) < (int)pLoop->nOut) {
    pLoop->nOut = (LogEst)((int)nRow - uVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nBase, pTerm=pWC->a; i>0; i--, pTerm++){
    assert( pTerm!=0 );
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      sqlite3ProgressCheck(pWC->pWInfo->pParse);
      if( pLoop->maskSelf==pTerm->prereqAll ){
        /* If there are extra terms in the WHERE clause not used by an index
        ** that depend only on the table being scanned, and that will tend to
        ** cause many rows to be omitted, then mark that table as
        ** "self-culling".
        **
        ** 2022-03-24:  Self-culling only applies if either the extra terms
        ** are straight comparison operators that are non-true with NULL
        ** operand, or if the loop is not an OUTER JOIN.
        */
        if( (pTerm->eOperator & 0x3f)!=0
         || (pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype
                  & (JT_LEFT|JT_LTORJ))==0
        ){
          pLoop->wsFlags |= WHERE_SELFCULL;
        }
      }
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0
         && (pTerm->wtFlags & TERM_HIGHTRUTH)==0  /* tag-20200224-1 */
        ){
          Expr *pRight = pTerm->pExpr->pRight;
          int k = 0;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k, 0) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ){
            pTerm->wtFlags |= TERM_HEURTRUTH;
            iReduce = k;
          }
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce ){
    pLoop->nOut = nRow - iReduce;
  }
}